

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O3

CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
* __thiscall
async_simple::coro::detail::LazyPromiseBase::
await_transform<async_simple::coro::detail::SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,std::allocator<async_simple::coro::Lazy<void>>>,std::allocator<async_simple::Try<void>>,false>>
          (CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
           *__return_storage_ptr__,LazyPromiseBase *this,
          SimpleCollectAllAwaitable<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
          *awaitable)

{
  atomic<unsigned_long> aVar1;
  CoroHandle<> CVar2;
  undefined1 local_59;
  CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
  local_58;
  
  CollectAllAwaiter<std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>,_std::allocator<async_simple::Try<void>_>,_false>
  ::CollectAllAwaiter(&local_58,awaitable,&local_59);
  CVar2.__handle_ = local_58._event._awaitingCoro.__handle_;
  aVar1.super___atomic_base<unsigned_long>._M_i =
       local_58._event._count.super___atomic_base<unsigned_long>._M_i;
  (__return_storage_ptr__->_input).
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58._input.
       super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_input).
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58._input.
       super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_input).
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58._input.
       super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._input.
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._input.
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._input.
  super__Vector_base<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_output).
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58._output.
       super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_output).
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58._output.
       super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_output).
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58._output.
       super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._output.
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._output.
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._output.
  super__Vector_base<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LOCK();
  local_58._event._count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  UNLOCK();
  (__return_storage_ptr__->_event)._count.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict1)aVar1.super___atomic_base<unsigned_long>._M_i;
  local_58._event._awaitingCoro.__handle_ = (void *)0x0;
  (__return_storage_ptr__->_event)._awaitingCoro.__handle_ = CVar2.__handle_;
  std::vector<async_simple::Try<void>,_std::allocator<async_simple::Try<void>_>_>::~vector
            (&local_58._output);
  std::vector<async_simple::coro::Lazy<void>,_std::allocator<async_simple::coro::Lazy<void>_>_>::
  ~vector(&local_58._input);
  return __return_storage_ptr__;
}

Assistant:

auto await_transform(Awaitable&& awaitable) {
        // See CoAwait.h for details.
        return detail::coAwait(_executor, std::forward<Awaitable>(awaitable));
    }